

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,
          NameAndDesc *nameAndDesc,SourceLineInfo *lineInfo)

{
  char *pcVar1;
  IMutableRegistryHub *pIVar2;
  undefined8 *in_RCX;
  char *in_RDX;
  SourceLineInfo *in_stack_00000078;
  string *in_stack_00000080;
  string *in_stack_00000088;
  string *in_stack_00000090;
  ITestCase *in_stack_00000098;
  TestCase *this_00;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string *in_stack_fffffffffffffe78;
  allocator local_151;
  string local_150 [32];
  string local_130 [32];
  undefined1 local_110 [240];
  undefined8 *local_20;
  char *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  pIVar2 = getMutableRegistryHub();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,local_18,&local_151);
  extractClassName(in_stack_fffffffffffffe78);
  pcVar1 = (char *)*local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe78,pcVar1,&local_189);
  pcVar1 = (char *)local_20[1];
  this_00 = (TestCase *)&local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,pcVar1,(allocator *)this_00);
  makeTestCase(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
               in_stack_00000078);
  (*pIVar2->_vptr_IMutableRegistryHub[3])(pIVar2,local_110);
  TestCase::~TestCase(this_00);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    char const* classOrQualifiedMethodName,
                                    NameAndDesc const& nameAndDesc,
                                    SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase( testCase,
                            extractClassName( classOrQualifiedMethodName ),
                            nameAndDesc.name,
                            nameAndDesc.description,
                            lineInfo ) );
    }